

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O1

int ExprEval::Operator::get_priority(string *symbol)

{
  pointer __s2;
  size_t sVar1;
  size_t __n;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  
  lVar3 = specification_table[1] - *specification_table;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 7;
    __s2 = (symbol->_M_dataplus)._M_p;
    sVar1 = symbol->_M_string_length;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    puVar4 = (undefined8 *)(*specification_table + 8);
    do {
      __n = puVar4[1];
      if ((__n == sVar1) && ((__n == 0 || (iVar2 = bcmp((void *)*puVar4,__s2,__n), iVar2 == 0)))) {
        return *(int *)(puVar4 + 0xe);
      }
      puVar4 = puVar4 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return -1;
}

Assistant:

int get_priority(const std::string& symbol){
            auto table = specification_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return table->at(i).priority;
            }
            return -1;
        }